

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::RecordCrossFrameEntryExitRecord
          (FunctionBody *this,uint byteCodeOffset,bool isEnterBlock)

{
  code *pcVar1;
  bool bVar2;
  CrossFrameEntryExitRecordList *pCVar3;
  Recycler *pRVar4;
  List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  AuxStatementData *pAVar5;
  undefined4 *puVar6;
  CrossFrameEntryExitRecord local_60;
  CrossFrameEntryExitRecord record;
  TrackAllocData local_48;
  Recycler *local_20;
  Recycler *recycler;
  bool isEnterBlock_local;
  FunctionBody *pFStack_10;
  uint byteCodeOffset_local;
  FunctionBody *this_local;
  
  recycler._3_1_ = isEnterBlock;
  recycler._4_4_ = byteCodeOffset;
  pFStack_10 = this;
  EnsureAuxStatementData(this);
  local_20 = ScriptContext::GetRecycler
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  pCVar3 = GetCrossFrameEntryExitRecords(this);
  pRVar4 = local_20;
  if (pCVar3 == (CrossFrameEntryExitRecordList *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,
               (type_info *)
               &JsUtil::
                List<Js::FunctionBody::CrossFrameEntryExitRecord,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1f68);
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_48);
    record = (CrossFrameEntryExitRecord)Memory::Recycler::AllocInlined;
    this_00 = (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::Recycler>(0x30,pRVar4,0x43c4b0);
    JsUtil::
    List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
    ::List(this_00,local_20,4);
    pAVar5 = Memory::WriteBarrierPtr<Js::FunctionBody::AuxStatementData>::operator->
                       (&(this->m_sourceInfo).m_auxStatementData);
    Memory::
    WriteBarrierPtr<JsUtil::List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::operator=(&pAVar5->m_crossFrameBlockEntryExisRecords,this_00);
  }
  pCVar3 = GetCrossFrameEntryExitRecords(this);
  if (pCVar3 == (CrossFrameEntryExitRecordList *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1f6a,"(this->GetCrossFrameEntryExitRecords())",
                                "this->GetCrossFrameEntryExitRecords()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  CrossFrameEntryExitRecord::CrossFrameEntryExitRecord
            (&local_60,recycler._4_4_,(bool)(recycler._3_1_ & 1));
  pCVar3 = GetCrossFrameEntryExitRecords(this);
  JsUtil::
  List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(pCVar3,&local_60);
  return;
}

Assistant:

void FunctionBody::RecordCrossFrameEntryExitRecord(uint byteCodeOffset, bool isEnterBlock)
    {
        this->EnsureAuxStatementData();

        Recycler* recycler = this->m_scriptContext->GetRecycler();
        if (this->GetCrossFrameEntryExitRecords() == nullptr)
        {
            m_sourceInfo.m_auxStatementData->m_crossFrameBlockEntryExisRecords = RecyclerNew(recycler, CrossFrameEntryExitRecordList, recycler);
        }
        Assert(this->GetCrossFrameEntryExitRecords());

        CrossFrameEntryExitRecord record(byteCodeOffset, isEnterBlock);
        this->GetCrossFrameEntryExitRecords()->Add(record); // Will copy stack value and put the copy into the container.
    }